

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

void __thiscall TypeSpacebase::saveXml(TypeSpacebase *this,ostream *s)

{
  allocator local_39;
  string local_38;
  
  std::operator<<(s,"<type");
  Datatype::saveXmlBasic(&this->super_Datatype,s);
  std::__cxx11::string::string((string *)&local_38,"space",&local_39);
  a_v(s,&local_38,&this->spaceid->name);
  std::__cxx11::string::~string((string *)&local_38);
  std::operator<<(s,'>');
  Address::saveXml(&this->localframe,s);
  std::operator<<(s,"</type>");
  return;
}

Assistant:

void TypeSpacebase::saveXml(ostream &s) const

{
  s << "<type";
  saveXmlBasic(s);
  a_v(s,"space",spaceid->getName());
  s << '>';
  localframe.saveXml(s);
  s << "</type>";
}